

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cc
# Opt level: O2

bool __thiscall avro::Validator::getNextFieldName(Validator *this,string *name)

{
  pointer pCVar1;
  element_type *peVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  name->_M_string_length = 0;
  *(name->_M_dataplus)._M_p = '\0';
  pCVar1 = (this->compoundStack_).
           super__Vector_base<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->compoundStack_).
                super__Vector_base<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1;
  uVar5 = (-1 - (uint)((uint)(this->nextType_ + ~AVRO_NULL) < 6)) + (int)(lVar3 / 0x18);
  if (-1 < (int)uVar5) {
    uVar5 = uVar5 & 0x7fffffff;
    peVar2 = pCVar1[uVar5].node.px;
    if (peVar2->type_ == AVRO_RECORD) {
      uVar6 = pCVar1[uVar5].pos - 1;
      uVar4 = (**(code **)((long)peVar2->_vptr_Node + 0x20))(peVar2,0x18,lVar3 % 0x18);
      if (uVar6 < uVar4) {
        peVar2 = pCVar1[uVar5].node.px;
        (**(code **)((long)peVar2->_vptr_Node + 0x40))(peVar2,uVar6 & 0xffffffff);
        std::__cxx11::string::_M_assign((string *)name);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool 
Validator::getNextFieldName(std::string &name) const
{
    bool found = false;
    name.clear();
    int idx = isCompound(nextType_) ? compoundStack_.size()-2 : compoundStack_.size()-1;
    if(idx >= 0 && compoundStack_[idx].node->type() == AVRO_RECORD) {
        size_t pos = compoundStack_[idx].pos-1;
        const NodePtr &node = compoundStack_[idx].node;
        if(pos < node->leaves()) {
            name = node->nameAt(pos);
            found = true;
        }
    }
    return found;
}